

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O3

ON_SubDComponentPoint *
ON_SubDComponentPoint::BestPickPoint
          (ON_SubDComponentPoint *__return_storage_ptr__,ON_PickType pick_type,
          double vertex_depth_bias,double edge_depth_bias,ON_SubDComponentPoint *A,
          ON_SubDComponentPoint *B)

{
  double dVar1;
  ON__UINT_PTR OVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  int iVar11;
  ON_SubDComponentPoint *pOVar12;
  sbyte sVar13;
  uint uVar14;
  long lVar15;
  ON_SubDComponentPoint *pOVar16;
  ON_PickPoint *pOVar17;
  ON_PickPoint *b;
  char cVar18;
  ON_SubDComponentPoint *pOVar19;
  ON_PickPoint *pOVar20;
  byte bVar21;
  byte bVar22;
  double *pdVar23;
  byte bVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  ON_PickPoint biased_B;
  ON_PickPoint biased_A;
  int local_130;
  double local_120;
  ON_PickPoint OStack_c0;
  ON_PickPoint OStack_78;
  
  bVar24 = 0;
  pOVar17 = &A->m_pick_point;
  b = &B->m_pick_point;
  iVar11 = ON_PickPoint::Compare(pOVar17,b);
  pOVar16 = (ON_SubDComponentPoint *)(A->m_component_ptr).m_ptr;
  uVar14 = (uint)pOVar16 & 6;
  sVar13 = (sbyte)uVar14;
  pOVar19 = (ON_SubDComponentPoint *)(B->m_component_ptr).m_ptr;
  switch((uint)pOVar19 & 6) {
  case 0:
    local_130 = 1;
    bVar10 = true;
    bVar8 = false;
    bVar9 = false;
    bVar22 = 1;
    bVar21 = 0;
    cVar18 = '\0';
    break;
  case 2:
    bVar8 = true;
    cVar18 = '\x02';
    bVar9 = false;
    goto LAB_005c64d7;
  case 4:
    cVar18 = '\x04';
    bVar9 = true;
    bVar8 = false;
LAB_005c64d7:
    local_130 = -1;
    bVar10 = false;
    bVar22 = 1;
    bVar21 = 0;
    break;
  case 6:
    local_130 = -1;
    cVar18 = '\x06';
    bVar21 = 1;
    bVar10 = false;
    bVar8 = false;
    bVar9 = false;
    bVar22 = 0;
  }
  pOVar12 = __return_storage_ptr__;
  if (cVar18 == (char)(0x6020402020200 >> (sbyte)(uVar14 << 3))) {
    if (iVar11 < 0) {
      A = B;
    }
  }
  else {
    if (1U >> sVar13 != 0) {
      lVar15 = 10;
      goto LAB_005c650e;
    }
    if (!bVar10) {
      if (pick_type == PointPick) {
        if (local_130 < 1) {
          bVar10 = Internal_FirstIsPartOfSecond(pOVar16,pOVar19);
          pOVar12 = A;
          if ((byte)(bVar22 & bVar10 & 0x3fU >> sVar13) == 0) goto code_r0x005c67f5;
        }
        else {
          bVar10 = Internal_FirstIsPartOfSecond(pOVar19,pOVar16);
          pOVar12 = B;
          if ((byte)(bVar22 & bVar10 & 0x3fU >> sVar13) != 1) {
code_r0x005c67f5:
            pOVar20 = &OStack_78;
            for (lVar15 = 9; lVar15 != 0; lVar15 = lVar15 + -1) {
              (pOVar20->m_point).x = (pOVar17->m_point).x;
              pOVar17 = (ON_PickPoint *)((long)pOVar17 + (ulong)bVar24 * -0x10 + 8);
              pOVar20 = (ON_PickPoint *)((long)pOVar20 + ((ulong)bVar24 * -2 + 1) * 8);
            }
            pOVar17 = &OStack_c0;
            for (lVar15 = 9; lVar15 != 0; lVar15 = lVar15 + -1) {
              (pOVar17->m_point).x = (b->m_point).x;
              b = (ON_PickPoint *)((long)b + (ulong)bVar24 * -0x10 + 8);
              pOVar17 = (ON_PickPoint *)((long)pOVar17 + ((ulong)bVar24 * -2 + 1) * 8);
            }
            if (((0 < local_130) || (OStack_78.m_distance <= 0.0)) || (1.0 < OStack_78.m_distance))
            {
              if (((0 < local_130) && (0.0 < OStack_c0.m_distance)) && (OStack_c0.m_distance <= 1.0)
                 ) {
                OStack_c0.m_distance = 0.0;
              }
            }
            else {
              OStack_78.m_distance = 0.0;
            }
            goto code_r0x005c6625;
          }
        }
        OVar2 = (pOVar12->m_component_ptr).m_ptr;
        dVar1 = (pOVar12->m_pick_point).m_point.x;
        dVar3 = (pOVar12->m_pick_point).m_point.y;
        dVar4 = (pOVar12->m_pick_point).m_point.z;
        dVar5 = (pOVar12->m_pick_point).m_t[0];
        dVar6 = (pOVar12->m_pick_point).m_t[1];
        dVar7 = (pOVar12->m_pick_point).m_t[3];
        (__return_storage_ptr__->m_pick_point).m_t[2] = (pOVar12->m_pick_point).m_t[2];
        (__return_storage_ptr__->m_pick_point).m_t[3] = dVar7;
        (__return_storage_ptr__->m_pick_point).m_t[0] = dVar5;
        (__return_storage_ptr__->m_pick_point).m_t[1] = dVar6;
        (__return_storage_ptr__->m_pick_point).m_point.y = dVar3;
        (__return_storage_ptr__->m_pick_point).m_point.z = dVar4;
        (__return_storage_ptr__->m_component_ptr).m_ptr = OVar2;
        (__return_storage_ptr__->m_pick_point).m_point.x = dVar1;
        dVar1 = ON_Min((A->m_pick_point).m_distance,(B->m_pick_point).m_distance);
        (__return_storage_ptr__->m_pick_point).m_distance = dVar1;
        dVar1 = (A->m_pick_point).m_depth;
        uVar25 = SUB84(dVar1,0);
        uVar26 = (undefined4)((ulong)dVar1 >> 0x20);
        dVar1 = (B->m_pick_point).m_depth;
        uVar27 = SUB84(dVar1,0);
        uVar28 = (undefined4)((ulong)dVar1 >> 0x20);
code_r0x005c67c4:
        dVar1 = ON_Max((double)CONCAT44(uVar26,uVar25),(double)CONCAT44(uVar28,uVar27));
        (__return_storage_ptr__->m_pick_point).m_depth = dVar1;
        return __return_storage_ptr__;
      }
      pOVar20 = &OStack_78;
      for (lVar15 = 9; lVar15 != 0; lVar15 = lVar15 + -1) {
        (pOVar20->m_point).x = (pOVar17->m_point).x;
        pOVar17 = (ON_PickPoint *)((long)pOVar17 + (ulong)bVar24 * -0x10 + 8);
        pOVar20 = (ON_PickPoint *)((long)pOVar20 + ((ulong)bVar24 * -2 + 1) * 8);
      }
      pOVar17 = &OStack_c0;
      for (lVar15 = 9; lVar15 != 0; lVar15 = lVar15 + -1) {
        (pOVar17->m_point).x = (b->m_point).x;
        b = (ON_PickPoint *)((long)b + (ulong)bVar24 * -0x10 + 8);
        pOVar17 = (ON_PickPoint *)((long)pOVar17 + ((ulong)bVar24 * -2 + 1) * 8);
      }
code_r0x005c6625:
      pdVar23 = &OStack_78.m_depth;
      if (((1.23432101234321e+308 <= vertex_depth_bias) || (vertex_depth_bias <= 0.0)) ||
         (!bVar8 && (0x2eU >> sVar13 & 1) == 0)) {
        local_120 = 0.0;
        if ((!bVar9 && (0x10U >> sVar13 & 1) == 0) ||
           ((-(0.0 < edge_depth_bias) & -(edge_depth_bias < 1.23432101234321e+308) &
             (bVar21 | 0x40U >> sVar13) & 1) == 0)) goto code_r0x005c673c;
        bVar10 = Internal_FirstIsPartOfSecond(pOVar16,pOVar19);
        edge_depth_bias = edge_depth_bias;
        if (!bVar10) {
          bVar10 = Internal_FirstIsPartOfSecond(pOVar19,pOVar16);
          goto joined_r0x005c68d5;
        }
      }
      else {
        bVar10 = Internal_FirstIsPartOfSecond(pOVar16,pOVar19);
        edge_depth_bias = vertex_depth_bias;
        if (!bVar10) {
          bVar10 = Internal_FirstIsPartOfSecond(pOVar19,pOVar16);
          edge_depth_bias = vertex_depth_bias;
joined_r0x005c68d5:
          local_120 = 0.0;
          pdVar23 = &OStack_c0.m_depth;
          if (!bVar10) goto code_r0x005c673c;
        }
      }
      local_120 = edge_depth_bias;
      *pdVar23 = *pdVar23 + local_120;
code_r0x005c673c:
      iVar11 = ON_PickPoint::Compare(&OStack_78,&OStack_c0);
      pOVar16 = A;
      if (iVar11 < 0) {
        pOVar16 = B;
      }
      pOVar19 = __return_storage_ptr__;
      for (lVar15 = 10; lVar15 != 0; lVar15 = lVar15 + -1) {
        (pOVar19->m_component_ptr).m_ptr = (pOVar16->m_component_ptr).m_ptr;
        pOVar16 = (ON_SubDComponentPoint *)((long)pOVar16 + (ulong)bVar24 * -0x10 + 8);
        pOVar19 = (ON_SubDComponentPoint *)((long)pOVar19 + (ulong)bVar24 * -0x10 + 8);
      }
      switch((uint)(__return_storage_ptr__->m_component_ptr).m_ptr & 6) {
      default:
        return __return_storage_ptr__;
      case 2:
        goto code_r0x005c6785;
      case 4:
        goto code_r0x005c677e;
      }
    }
  }
  lVar15 = 10;
  B = A;
LAB_005c650e:
  for (; lVar15 != 0; lVar15 = lVar15 + -1) {
    (pOVar12->m_component_ptr).m_ptr = (B->m_component_ptr).m_ptr;
    B = (ON_SubDComponentPoint *)((long)B + (ulong)bVar24 * -0x10 + 8);
    pOVar12 = (ON_SubDComponentPoint *)((long)pOVar12 + (ulong)bVar24 * -0x10 + 8);
  }
  return __return_storage_ptr__;
code_r0x005c677e:
  if (bVar21 == 0 && (0x40U >> sVar13 & 1) == 0) {
    return __return_storage_ptr__;
  }
code_r0x005c6785:
  if (local_120 < ABS((A->m_pick_point).m_depth - (B->m_pick_point).m_depth)) {
    return __return_storage_ptr__;
  }
  dVar1 = ON_Min((A->m_pick_point).m_distance,(B->m_pick_point).m_distance);
  (__return_storage_ptr__->m_pick_point).m_distance = dVar1;
  dVar1 = (A->m_pick_point).m_depth;
  uVar25 = SUB84(dVar1,0);
  uVar26 = (undefined4)((ulong)dVar1 >> 0x20);
  dVar1 = (B->m_pick_point).m_depth;
  uVar27 = SUB84(dVar1,0);
  uVar28 = (undefined4)((ulong)dVar1 >> 0x20);
  goto code_r0x005c67c4;
}

Assistant:

const ON_SubDComponentPoint ON_SubDComponentPoint::BestPickPoint(
  ON_PickType pick_type,
  double vertex_depth_bias,
  double edge_depth_bias,
  const ON_SubDComponentPoint& A,
  const ON_SubDComponentPoint& B
)
{
  // If you're working on a bug where somebody isn't able to pick the SubD component
  // they thought they clicked on, then you're in the right place.
  // Mikko has done lots of work in this area and be sure to retest RH-52172 and RH-52173 (fixed 3 May 2019).
  // Also, retest RH-59666 (fixed August 2020).
  //
  // This function will be a work in progress for many years.

  // unbiased_compare ignores SubD component types and relative topological relationships.
  // If unbiased_compare == 1, then A is "best" from this "unbiased" point of views.
  const int unbiased_compare = (ON_PickPoint::Compare(A.m_pick_point, B.m_pick_point)>=0) ? 1 : -1;
  
  const ON_SubDComponentPtr::Type A_component_type = A.m_component_ptr.ComponentType();
  const ON_SubDComponentPtr::Type B_component_type = B.m_component_ptr.ComponentType();
  if (A_component_type == B_component_type)
  {
    // A and B are the same type of component
    return (unbiased_compare >= 0) ? A : B;
  }
  if (ON_SubDComponentPtr::Type::Unset == A_component_type)
    return B;
  if (ON_SubDComponentPtr::Type::Unset == B_component_type)
    return A;

  // If we get this far, then A and B are pick events on different types of SubD components.

  // type_bias = 1 if A is a vertex and B is an edge/face or A is an edge and B is a face.
  // type_bias = -1 if B is a vertex and A is an edge/face or B is an edge and A is a face.
  const int type_bias = (ON_SubDComponentPtr::CompareComponentPtrType(A_component_type, B_component_type)) <= 0 ? 1 : -1;

  // 17 Dec 2024, Mikko, RH-85024:
  // Skip the following section if either component is a face. 
  // In that case it gives the wrong answer if you click on an opaque shaded SubD face, 
  // and at the same time hit an edge/vertex of the same face behind the shaded part.
  if (
    ON_PickType::PointPick == pick_type
    && ((type_bias >= 0) ? Internal_FirstIsPartOfSecond(A, B) : Internal_FirstIsPartOfSecond(B, A))
    && ON_SubDComponentPtr::Type::Face != A_component_type
    && ON_SubDComponentPtr::Type::Face != B_component_type
    )
  {
    // A point pick is occurring and best is a vertex on an edge/face or best is an edge on a face.
    // Bias towards the vertex/edge.
    // Users can pick the middle of an edge/face if they want the "bigger" component.
    ON_SubDComponentPoint best = (type_bias >= 0) ? A : B;
    best.m_pick_point.m_distance = ON_Min(A.m_pick_point.m_distance, B.m_pick_point.m_distance);
    best.m_pick_point.m_depth = ON_Max(A.m_pick_point.m_depth, B.m_pick_point.m_depth);
    return best;
  }

  ON_PickPoint biased_A(A.m_pick_point);
  ON_PickPoint biased_B(B.m_pick_point);

  // distance bias applied to point picks on vertices and edges
  // Events with smaller distances are "better" because they are visually are closer to the picked point.
  if (ON_PickType::PointPick == pick_type)
  {
    // 18 Aug 2020 Dale Lear:
    //   The pick distance for a point pick is normalized so 1.0 = pick frustum radius. 
    //   Reasonable values for distance_tol are 0.25 to 1.0.
    //   0.5 fixes RH-52172
    //   1.0 seems to fix bugs like RH-59666 (0.5 is too small to fix RH-59666).
    const double distance_tol = 1.0;

    if ( type_bias > 0 && biased_A.m_distance > 0.0 && biased_A.m_distance <= distance_tol)
      biased_A.m_distance = 0.0; // consider pick A to be on the vertex/edge

    if ( type_bias < 0 && biased_B.m_distance > 0.0 && biased_B.m_distance <= distance_tol )
      biased_B.m_distance = 0.0; // consider pick B to be on the vertex/edge
  }

  // Apply a depth bias when we have a relative topological relationship between the components
  // (vertex on edge, vertex on face, or edge on face).
  // Events with larger depths are "better" because they are in front of smaller depths.
  double depth_bias = 0.0;
  const bool bHaveVertex = ON_SubDComponentPtr::Type::Vertex == A_component_type || ON_SubDComponentPtr::Type::Vertex == B_component_type;
  const bool bHaveEdge = ON_SubDComponentPtr::Type::Edge == A_component_type || ON_SubDComponentPtr::Type::Edge == B_component_type;
  const bool bHaveFace = ON_SubDComponentPtr::Type::Face == A_component_type || ON_SubDComponentPtr::Type::Face == B_component_type;
  if ( bHaveVertex && vertex_depth_bias > 0.0 && vertex_depth_bias < ON_UNSET_POSITIVE_VALUE  )
  {
    // One event is a vertex, the other event is an edge or face, and a vertex bias was supplied.
    // Test to see if the vertex is on the edge or face.
    if (Internal_FirstIsPartOfSecond(A,B))
    {
      // B is an edge/face and A is a vertex on the edge/face
      depth_bias = vertex_depth_bias;
      biased_A.m_depth += depth_bias; // bias vertex closer
    }
    else if (Internal_FirstIsPartOfSecond(B, A))
    {
      // A is an edge/face and B is a vertex on the edge/face
      depth_bias = vertex_depth_bias;
      biased_B.m_depth += depth_bias; // bias vertex closer
    }
  }
  else if ( bHaveEdge && bHaveFace && edge_depth_bias > 0.0  && edge_depth_bias < ON_UNSET_POSITIVE_VALUE )
  {
    // One event is an edge, the other event is a face, and an edge bias was supplied.
    // Test to see if the edge is on the face.
    if (Internal_FirstIsPartOfSecond(A, B))
    {
      // B is a face and A is an edge on the face
      depth_bias = edge_depth_bias;
      biased_A.m_depth += depth_bias; // bias edge closer
    }
    else if (Internal_FirstIsPartOfSecond(B, A))
    {
      // A is a face and B is an edge on the face
      depth_bias = edge_depth_bias;
      biased_B.m_depth += depth_bias; // bias edge closer
    }
  }

  // biased_compare adds a bias towards vertices and edges based on SubD component types and relative topological relationships.
  // If biased_compare >= 0, then A is "best" from this biased point of views.
  const int biased_compare = (ON_PickPoint::Compare(biased_A, biased_B)>=0) ? 1 : -1;

  ON_SubDComponentPoint best = (biased_compare >= 0) ? A : B;

  const ON_SubDComponentPtr::Type best_type = best.m_component_ptr.ComponentType();
  if ( ON_SubDComponentPtr::Type::Vertex == best_type || (ON_SubDComponentPtr::Type::Edge == best_type && bHaveFace) )
  {
    // Either a vertex was better than an edge/face or an edge was better than a face.
    if (fabs(A.m_pick_point.m_depth - B.m_pick_point.m_depth) <= depth_bias)
    {
      // The two pick points were "close" in depth.
      // In these cases, strengthen "best" by using the "best" depth and distance values from A and B.
      best.m_pick_point.m_distance = ON_Min(A.m_pick_point.m_distance, B.m_pick_point.m_distance);
      best.m_pick_point.m_depth = ON_Max(A.m_pick_point.m_depth, B.m_pick_point.m_depth);
    }
  }

  return best;
}